

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUPlugin.cpp
# Opt level: O0

void __thiscall beagle::cpu::BeagleCPUPlugin::BeagleCPUPlugin(BeagleCPUPlugin *this)

{
  undefined8 *puVar1;
  value_type *__x;
  undefined8 *in_RDI;
  BeagleResource resource;
  BeagleCPUImplFactory<double> *in_stack_ffffffffffffff60;
  BeagleCPUImplFactory<float> *this_00;
  value_type *in_stack_ffffffffffffff68;
  list<BeagleResource,_std::allocator<BeagleResource>_> *in_stack_ffffffffffffff70;
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *this_01;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  Plugin *in_stack_ffffffffffffffc0;
  
  plugin::Plugin::Plugin
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *in_RDI = &PTR_pluginName_abi_cxx11__001c92c0;
  std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::push_back
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  BeagleCPU4StateImplFactory<double>::BeagleCPU4StateImplFactory
            ((BeagleCPU4StateImplFactory<double> *)in_stack_ffffffffffffff60);
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  push_back((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
            in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  BeagleCPU4StateImplFactory<float>::BeagleCPU4StateImplFactory
            ((BeagleCPU4StateImplFactory<float> *)in_stack_ffffffffffffff60);
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  push_back((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
            in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  this_01 = (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
            (in_RDI + 1);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  BeagleCPUImplFactory<double>::BeagleCPUImplFactory(in_stack_ffffffffffffff60);
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  push_back(this_01,(value_type *)in_stack_ffffffffffffff68);
  this_00 = (BeagleCPUImplFactory<float> *)(in_RDI + 1);
  __x = (value_type *)operator_new(8);
  *__x = (value_type)0x0;
  BeagleCPUImplFactory<float>::BeagleCPUImplFactory(this_00);
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  push_back(this_01,__x);
  return;
}

Assistant:

BeagleCPUPlugin::BeagleCPUPlugin() :
Plugin("CPU", "CPU")
{
	BeagleResource resource;
#ifdef __aarch64__
	    resource.name = (char*) "CPU (arm64)";
#else
        resource.name = (char*) "CPU (x86_64)";
#endif
        resource.description = (char*) "";
        resource.supportFlags = BEAGLE_FLAG_COMPUTATION_SYNCH |
                                         BEAGLE_FLAG_SCALING_MANUAL | BEAGLE_FLAG_SCALING_ALWAYS | BEAGLE_FLAG_SCALING_AUTO | BEAGLE_FLAG_SCALING_DYNAMIC |
                                         BEAGLE_FLAG_THREADING_NONE | BEAGLE_FLAG_THREADING_CPP |
                                         BEAGLE_FLAG_PROCESSOR_CPU |
                                         BEAGLE_FLAG_PRECISION_SINGLE | BEAGLE_FLAG_PRECISION_DOUBLE |
                                         BEAGLE_FLAG_VECTOR_NONE |
                                         BEAGLE_FLAG_SCALERS_LOG | BEAGLE_FLAG_SCALERS_RAW |
                                         BEAGLE_FLAG_EIGEN_COMPLEX | BEAGLE_FLAG_EIGEN_REAL |
                                         BEAGLE_FLAG_INVEVEC_STANDARD | BEAGLE_FLAG_INVEVEC_TRANSPOSED |
                                         BEAGLE_FLAG_PREORDER_TRANSPOSE_MANUAL | BEAGLE_FLAG_PREORDER_TRANSPOSE_AUTO |
                                         BEAGLE_FLAG_FRAMEWORK_CPU;
        resource.requiredFlags = BEAGLE_FLAG_FRAMEWORK_CPU;
	beagleResources.push_back(resource);

	// Optional for plugins: check if the hardware is compatible and only populate
	// list with compatible factories
	beagleFactories.push_back(new beagle::cpu::BeagleCPU4StateImplFactory<double>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPU4StateImplFactory<float>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPUImplFactory<double>());
	beagleFactories.push_back(new beagle::cpu::BeagleCPUImplFactory<float>());
}